

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCustomCommandGenerator.cxx
# Opt level: O0

string * __thiscall
cmCustomCommandGenerator::GetInternalDepfile_abi_cxx11_
          (string *__return_storage_ptr__,cmCustomCommandGenerator *this)

{
  ulong uVar1;
  allocator<char> local_39;
  undefined1 local_38 [8];
  string depfile;
  cmCustomCommandGenerator *this_local;
  
  depfile.field_2._8_8_ = this;
  GetFullDepfile_abi_cxx11_((string *)local_38,this);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::
    function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
    ::operator()(__return_storage_ptr__,&this->ComputeInternalDepfile,&this->OutputConfig,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_38);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"",&local_39);
    std::allocator<char>::~allocator(&local_39);
  }
  std::__cxx11::string::~string((string *)local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCustomCommandGenerator::GetInternalDepfile() const
{
  std::string depfile = this->GetFullDepfile();
  if (depfile.empty()) {
    return "";
  }

  return this->ComputeInternalDepfile(this->OutputConfig, depfile);
}